

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O3

void __thiscall
SQInstance::SQInstance(SQInstance *this,SQSharedState *ss,SQClass *c,SQInteger memsize)

{
  long *plVar1;
  SQUnsignedInteger *pSVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  ulong uVar6;
  long lVar7;
  
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef = 0;
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._weakref = (SQWeakRef *)0x0;
  (this->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted =
       (_func_int **)&PTR__SQInstance_001a3198;
  this->_values[0].super_SQObject._type = 0;
  this->_values[0].super_SQObject._flags = '\0';
  *(undefined3 *)&this->_values[0].super_SQObject.field_0x5 = 0;
  this->_values[0].super_SQObject._unVal.pTable = (SQTable *)0x0;
  this->_values[0].super_SQObject._type = OT_NULL;
  this->_memsize = memsize;
  this->_class = c;
  uVar6 = (ulong)(c->_defaultvalues)._size;
  if (uVar6 != 0) {
    lVar7 = 0;
    do {
      puVar3 = (undefined8 *)
               ((long)&(((c->_defaultvalues)._vals)->val).super_SQObject._type + lVar7);
      uVar5 = puVar3[1];
      puVar4 = (undefined8 *)((long)&this->_values[0].super_SQObject._type + lVar7);
      *puVar4 = *puVar3;
      puVar4[1] = uVar5;
      if ((*(byte *)((long)&this->_values[0].super_SQObject._type + lVar7 + 3) & 8) != 0) {
        plVar1 = (long *)(*(long *)((long)&this->_values[0].super_SQObject._unVal + lVar7) + 8);
        *plVar1 = *plVar1 + 1;
      }
      lVar7 = lVar7 + 0x10;
    } while (uVar6 << 4 != lVar7);
  }
  this->_alloc_ctx = ss->_alloc_ctx;
  this->_userpointer = (SQUserPointer)0x0;
  this->_hook = (SQRELEASEHOOK)0x0;
  pSVar2 = &(c->super_SQCollectable).super_SQRefCounted._uiRef;
  *pSVar2 = *pSVar2 + 1;
  (this->super_SQDelegable)._delegate = c->_members;
  (this->super_SQDelegable).super_SQCollectable._gc_next = (SQCollectable *)0x0;
  (this->super_SQDelegable).super_SQCollectable._gc_prev = (SQCollectable *)0x0;
  (this->super_SQDelegable).super_SQCollectable._sharedstate = ss;
  SQCollectable::AddToChain(&ss->_gc_chain,(SQCollectable_conflict *)this);
  return;
}

Assistant:

SQInstance::SQInstance(SQSharedState *ss, SQClass *c, SQInteger memsize)
{
    _memsize = memsize;
    _class = c;
    SQUnsignedInteger nvalues = _class->_defaultvalues.size();
    for(SQUnsignedInteger n = 0; n < nvalues; n++) {
        new (&_values[n]) SQObjectPtr(_class->_defaultvalues[n].val);
    }
    Init(ss);
}